

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

mraa_result_t mraa_uart_flush(mraa_uart_context dev)

{
  _func_mraa_result_t_mraa_uart_context *UNRECOVERED_JUMPTABLE;
  mraa_result_t mVar1;
  int iVar2;
  
  if (dev == (mraa_uart_context)0x0) {
    syslog(3,"uart: flush: context is NULL");
    mVar1 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->uart_flush_replace,
       UNRECOVERED_JUMPTABLE != (_func_mraa_result_t_mraa_uart_context *)0x0)) {
      mVar1 = (*UNRECOVERED_JUMPTABLE)(dev);
      return mVar1;
    }
    iVar2 = tcdrain(dev->fd);
    mVar1 = (uint)(iVar2 == -1) * 2;
  }
  return mVar1;
}

Assistant:

mraa_result_t
mraa_uart_flush(mraa_uart_context dev)
{
    if (!dev) {
        syslog(LOG_ERR, "uart: flush: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, uart_flush_replace)) {
        return dev->advance_func->uart_flush_replace(dev);
    }

#if !defined(PERIPHERALMAN)
    if (tcdrain(dev->fd) == -1) {
        return MRAA_ERROR_FEATURE_NOT_SUPPORTED;
    }
#endif

    return MRAA_SUCCESS;
}